

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O1

cbtBroadphaseProxy * __thiscall
cbtAxisSweep3Internal<unsigned_short>::createProxy
          (cbtAxisSweep3Internal<unsigned_short> *this,cbtVector3 *aabbMin,cbtVector3 *aabbMax,
          int shapeType,void *userPtr,int collisionFilterGroup,int collisionFilterMask,
          cbtDispatcher *dispatcher)

{
  cbtDbvtBroadphase *pcVar1;
  unsigned_short uVar2;
  int iVar3;
  undefined4 extraout_var;
  cbtBroadphaseProxy *pcVar4;
  
  uVar2 = addHandle(this,aabbMin,aabbMax,userPtr,collisionFilterGroup,collisionFilterMask,dispatcher
                   );
  pcVar4 = (cbtBroadphaseProxy *)
           ((long)(this->m_pHandles->super_cbtBroadphaseProxy).m_aabbMin.m_floats +
           ((ulong)((uint)uVar2 * 0x48) - 0x14));
  pcVar1 = this->m_raycastAccelerator;
  if (pcVar1 != (cbtDbvtBroadphase *)0x0) {
    iVar3 = (*(pcVar1->super_cbtBroadphaseInterface)._vptr_cbtBroadphaseInterface[2])
                      (pcVar1,aabbMin,aabbMax,(ulong)(uint)shapeType,userPtr,collisionFilterGroup,
                       (ulong)(uint)collisionFilterMask,dispatcher);
    pcVar4[1].m_collisionFilterGroup = iVar3;
    pcVar4[1].m_collisionFilterMask = extraout_var;
  }
  return pcVar4;
}

Assistant:

cbtBroadphaseProxy* cbtAxisSweep3Internal<BP_FP_INT_TYPE>::createProxy(const cbtVector3& aabbMin, const cbtVector3& aabbMax, int shapeType, void* userPtr, int collisionFilterGroup, int collisionFilterMask, cbtDispatcher* dispatcher)
{
	(void)shapeType;
	BP_FP_INT_TYPE handleId = addHandle(aabbMin, aabbMax, userPtr, collisionFilterGroup, collisionFilterMask, dispatcher);

	Handle* handle = getHandle(handleId);

	if (m_raycastAccelerator)
	{
		cbtBroadphaseProxy* rayProxy = m_raycastAccelerator->createProxy(aabbMin, aabbMax, shapeType, userPtr, collisionFilterGroup, collisionFilterMask, dispatcher);
		handle->m_dbvtProxy = rayProxy;
	}
	return handle;
}